

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O2

void __thiscall Buffer::DeleteFile(Buffer *this,string *filename)

{
  __type _Var1;
  int iVar2;
  undefined8 in_RAX;
  iterator __position;
  ostream *poVar3;
  undefined4 uStack_38;
  int pos;
  
  __position._M_node =
       (this->Occupy_Block).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
       super__List_node_base._M_next;
  _uStack_38 = in_RAX;
  while (__position._M_node != (_List_node_base *)&this->Occupy_Block) {
    _Var1 = std::operator==(&this->buffer[*(int *)&__position._M_node[1]._M_next].FileName,filename)
    ;
    if (_Var1) {
      _uStack_38 = CONCAT44(*(int *)&__position._M_node[1]._M_next,uStack_38);
      Block::BlockClear(this->buffer + *(int *)&__position._M_node[1]._M_next);
      this->Dirty[pos] = 0;
      this->Pin[pos] = 0;
      __position = std::__cxx11::list<int,_std::allocator<int>_>::erase
                             (&this->Occupy_Block,__position._M_node);
      std::__cxx11::list<int,_std::allocator<int>_>::push_back(&this->Empty_Block,&pos);
    }
    else {
      __position._M_node = (__position._M_node)->_M_next;
    }
  }
  iVar2 = remove((filename->_M_dataplus)._M_p);
  if (iVar2 == 0) {
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Delete file ");
  poVar3 = std::operator<<(poVar3,(string *)filename);
  poVar3 = std::operator<<(poVar3," failed!");
  std::endl<char,std::char_traits<char>>(poVar3);
  system("pause");
  exit(1);
}

Assistant:

void Buffer::DeleteFile(string filename) {
	int pos;
	list<int>::iterator it;
 	for (it = this->Occupy_Block.begin(); it != this->Occupy_Block.end();) {
		if (this->buffer[*it].FileName == filename) {
			pos = *it;
			this->buffer[pos].BlockClear();				//�����ļ���buffer�еĿ�ȫ�����
			this->UnDirt(pos);
			this->UnLock(pos);
			it = this->Occupy_Block.erase(it);
			this->Empty_Block.push_back(pos);
		}
		else {
			it++;
		}
	}
	if (remove(filename.c_str()) != 0) {
		cout << "Delete file " << filename << " failed!" << endl;
		system("pause");
		exit(1);
	}
}